

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

int Cbs_VarFanin0Value(Gia_Obj_t *pVar)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)((uint)*(undefined8 *)pVar & 0x1fffffff);
  if ((pVar[-uVar2].field_0x3 & 0x40) == 0) {
    uVar1 = 2;
  }
  else {
    uVar1 = Cbs_VarValue(pVar + -uVar2);
    uVar1 = *(uint *)pVar >> 0x1d & 1 ^ uVar1;
  }
  return uVar1;
}

Assistant:

static inline int   Cbs_VarFanin0Value( Gia_Obj_t * pVar )     { return !Cbs_VarIsAssigned(Gia_ObjFanin0(pVar)) ? 2 : (Cbs_VarValue(Gia_ObjFanin0(pVar)) ^ Gia_ObjFaninC0(pVar)); }